

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O0

bool __thiscall QKeySequenceEdit::event(QKeySequenceEdit *this,QEvent *e)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  sockaddr *__addr;
  int __fd;
  QEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QKeyEvent *ke;
  QKeySequenceEditPrivate *d;
  QEvent *in_stack_000000f8;
  QWidget *in_stack_00000100;
  QKeyCombination *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool local_d;
  QEvent *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RSI;
  d_func((QKeySequenceEdit *)0x5a73ef);
  __fd = (int)pQVar4;
  TVar3 = QEvent::type(in_RSI);
  if (TVar3 == KeyPress) {
    QKeyEvent::keyCombination
              ((QKeyEvent *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    bVar2 = QListSpecialMethodsBase<QKeyCombination>::contains<QKeyCombination>
                      ((QListSpecialMethodsBase<QKeyCombination> *)
                       CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      (**(code **)(*in_RDI + 0xc0))(in_RDI,in_RSI);
      local_d = true;
      goto LAB_005a74ae;
    }
  }
  else {
    if (TVar3 == ShortcutOverride) {
      QEvent::accept(in_RSI,__fd,__addr,(socklen_t *)(ulong)TVar3);
      local_d = true;
      goto LAB_005a74ae;
    }
    if (TVar3 == Shortcut) {
      local_d = true;
      goto LAB_005a74ae;
    }
  }
  local_d = QWidget::event(in_stack_00000100,in_stack_000000f8);
LAB_005a74ae:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_d;
}

Assistant:

bool QKeySequenceEdit::event(QEvent *e)
{
    Q_D(const QKeySequenceEdit);

    switch (e->type()) {
    case QEvent::Shortcut:
        return true;
    case QEvent::ShortcutOverride:
        e->accept();
        return true;
    case QEvent::KeyPress: {
            QKeyEvent *ke = static_cast<QKeyEvent *>(e);
            if (!d->finishingKeyCombinations.contains(ke->keyCombination())) {
                keyPressEvent(ke);
                return true;
            }
        }
        break;
    default:
        break;
    }

    return QWidget::event(e);
}